

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O0

void __thiscall avro::ArraySkipper::parse(ArraySkipper *this,Reader *reader,uint8_t *address)

{
  int64_t iVar1;
  type pRVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ReaderImpl<avro::NullValidator> *in_RDI;
  int64_t i;
  int64_t size;
  long local_28;
  
  avro::operator<<((NoOp *)&noop,(char (*) [15])"Skipping array");
  do {
    iVar1 = ReaderImpl<avro::NullValidator>::readArrayBlockSize(in_RDI);
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      pRVar2 = boost::shared_ptr<avro::Resolver>::operator->
                         ((shared_ptr<avro::Resolver> *)(in_RDI + 8));
      (**pRVar2->_vptr_Resolver)(pRVar2,in_RSI,in_RDX);
    }
  } while (iVar1 != 0);
  return;
}

Assistant:

virtual void parse(Reader &reader, uint8_t *address) const
    {
        DEBUG_OUT("Skipping array");

        int64_t size = 0;
        do {
            size = reader.readArrayBlockSize();
            for(int64_t i = 0; i < size; ++i) {
                resolver_->parse(reader, address);
            }
        } while (size != 0);
    }